

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O2

int cea708_add_cc_data(cea708_t *cea708,int valid,cea708_cc_type_t type,uint16_t cc_data)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = *(ushort *)&cea708->user_data;
  uVar2 = uVar1 >> 3 & 0x1f;
  if (uVar2 != 0x1f) {
    (cea708->user_data).cc_data[uVar2] =
         (cc_data_t)
         ((uint)(byte)(cea708->user_data).cc_data[uVar2].field_0x3 * 0x1000000 +
          ((uint)cc_data << 8 | (type & cc_type_dtvcc_packet_start) << 6 | (valid & 1U) << 5) + 0x1f
         );
    *(ushort *)&cea708->user_data = uVar1 & 0xff07 | uVar1 + 8 & 0xf8;
  }
  return (uint)(uVar2 != 0x1f);
}

Assistant:

int cea708_add_cc_data(cea708_t* cea708, int valid, cea708_cc_type_t type, uint16_t cc_data)
{
    if (31 <= cea708->user_data.cc_count) {
        return 0;
    }

    cea708->user_data.cc_data[cea708->user_data.cc_count].marker_bits = 0x1F;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_valid = valid;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_type = type;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_data = cc_data;
    ++cea708->user_data.cc_count;
    return 1;
}